

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

bool __thiscall aiFace::operator==(aiFace *this,aiFace *o)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  puVar4 = this->mIndices;
  puVar5 = o->mIndices;
  if (puVar4 == puVar5) {
    return true;
  }
  if ((puVar4 == (uint *)0x0) || (this->mNumIndices != o->mNumIndices)) {
    return false;
  }
  uVar3 = this->mNumIndices;
  bVar8 = uVar3 == 0;
  if ((!bVar8) && (*puVar4 == *puVar5)) {
    lVar7 = 1;
    do {
      uVar6 = (uint)lVar7;
      if (uVar3 == uVar6) break;
      puVar1 = puVar4 + lVar7;
      puVar2 = puVar5 + lVar7;
      lVar7 = lVar7 + 1;
    } while (*puVar1 == *puVar2);
    bVar8 = uVar3 <= uVar6;
  }
  return bVar8;
}

Assistant:

bool operator== (const aiFace& o) const {
        if (mIndices == o.mIndices) {
            return true;
        }

        if (nullptr != mIndices && mNumIndices != o.mNumIndices) {
            return false;
        }

        if (nullptr == mIndices) {
            return false;
        }

        for (unsigned int i = 0; i < this->mNumIndices; ++i) {
            if (mIndices[i] != o.mIndices[i]) {
                return false;
            }
        }

        return true;
    }